

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRetF.c
# Opt level: O1

void Aig_ManRetimeMark(Aig_Man_t *p)

{
  ulong *puVar1;
  undefined1 *puVar2;
  void *pvVar3;
  long *plVar4;
  long *plVar5;
  Aig_Obj_t *pObj;
  undefined8 *puVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  Vec_Ptr_t *pVVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  
  lVar10 = (long)p->vObjs->nSize;
  if (0 < lVar10) {
    lVar13 = 0;
    do {
      pvVar3 = p->vObjs->pArray[lVar13];
      if ((pvVar3 != (void *)0x0) && ((*(byte *)((long)pvVar3 + 0x18) & 0x20) != 0)) {
        __assert_fail("pObj->fMarkB == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRetF.c"
                      ,0x4f,"void Aig_ManRetimeMark(Aig_Man_t *)");
      }
      lVar13 = lVar13 + 1;
    } while (lVar10 != lVar13);
  }
  if (p->nRegs < p->nObjs[2]) {
    lVar10 = 0;
    do {
      if (p->vCis->nSize <= lVar10) goto LAB_006cc9b0;
      puVar1 = (ulong *)((long)p->vCis->pArray[lVar10] + 0x18);
      *puVar1 = *puVar1 | 0x20;
      lVar10 = lVar10 + 1;
    } while (lVar10 < (long)p->nObjs[2] - (long)p->nRegs);
  }
  iVar9 = p->nRegs;
  if (0 < iVar9) {
    iVar8 = 0;
    do {
      uVar12 = (p->nObjs[3] - iVar9) + iVar8;
      if (((((int)uVar12 < 0) || (p->vCos->nSize <= (int)uVar12)) ||
          (uVar14 = (p->nObjs[2] - iVar9) + iVar8, (int)uVar14 < 0)) ||
         (p->vCis->nSize <= (int)uVar14)) goto LAB_006cc9b0;
      plVar4 = (long *)p->vCis->pArray[uVar14];
      if (*plVar4 != 0) {
        __assert_fail("pObjLo->pNext == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRetF.c"
                      ,0x55,"void Aig_ManRetimeMark(Aig_Man_t *)");
      }
      plVar5 = (long *)p->vCos->pArray[uVar12];
      if (*plVar5 != 0) {
        __assert_fail("pObjLi->pNext == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigRetF.c"
                      ,0x56,"void Aig_ManRetimeMark(Aig_Man_t *)");
      }
      *plVar4 = (long)plVar5;
      *plVar5 = (long)plVar4;
      iVar8 = iVar8 + 1;
      iVar9 = p->nRegs;
    } while (iVar8 < iVar9);
  }
  do {
    Aig_ManIncrementTravId(p);
    pVVar11 = p->vCos;
    if (pVVar11->nSize < 1) break;
    lVar10 = 0;
    bVar7 = false;
    do {
      pObj = (Aig_Obj_t *)pVVar11->pArray[lVar10];
      if (((pObj->field_0x18 & 0x20) == 0) && (iVar9 = Aig_ManRetimeMark_rec(p,pObj), iVar9 != 0)) {
        bVar7 = true;
        if ((pObj->field_0).pNext != (Aig_Obj_t *)0x0) {
          puVar2 = &((pObj->field_0).pNext)->field_0x18;
          *puVar2 = *puVar2 | 0x20;
        }
      }
      lVar10 = lVar10 + 1;
      pVVar11 = p->vCos;
    } while (lVar10 < pVVar11->nSize);
  } while (bVar7);
  iVar9 = p->nRegs;
  if (0 < iVar9) {
    iVar8 = 0;
    do {
      uVar12 = (p->nObjs[3] - iVar9) + iVar8;
      if ((((int)uVar12 < 0) || (p->vCos->nSize <= (int)uVar12)) ||
         ((uVar14 = (p->nObjs[2] - iVar9) + iVar8, (int)uVar14 < 0 ||
          (p->vCis->nSize <= (int)uVar14)))) {
LAB_006cc9b0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar6 = (undefined8 *)p->vCis->pArray[uVar14];
      *(undefined8 *)p->vCos->pArray[uVar12] = 0;
      *puVar6 = 0;
      iVar8 = iVar8 + 1;
      iVar9 = p->nRegs;
    } while (iVar8 < iVar9);
  }
  return;
}

Assistant:

void Aig_ManRetimeMark( Aig_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int fChange, i;
    // mark the PIs
    Aig_ManForEachObj( p, pObj, i )
        assert( pObj->fMarkB == 0 );
    Aig_ManForEachPiSeq( p, pObj, i )
        pObj->fMarkB = 1;
    // map registers into each other
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
    {
        assert( pObjLo->pNext == NULL );
        assert( pObjLi->pNext == NULL );
        pObjLo->pNext = pObjLi;
        pObjLi->pNext = pObjLo;
    }
    // iterativively mark the logic reachable from PIs
    fChange = 1;
    while ( fChange )
    {
        fChange = 0;
        Aig_ManIncrementTravId( p );
        Aig_ManForEachCo( p, pObj, i )
        {
            if ( pObj->fMarkB )
                continue;
            if ( Aig_ManRetimeMark_rec( p, pObj ) )
            {
                if ( pObj->pNext )
                    pObj->pNext->fMarkB = 1;
                fChange = 1;
            }
        }
    }
    // clean register mapping
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = pObjLi->pNext = NULL;
}